

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnWriteVer.c
# Opt level: O0

void Wln_WriteVerInt(FILE *pFile,Wln_Ntk_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iObj_00;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  byte bVar13;
  char *pcVar14;
  bool bVar15;
  char *local_3f0;
  undefined8 local_f8;
  char *pInNames [8];
  int nRange;
  int Num1;
  int Num0;
  int nDigits;
  int Beg;
  int End;
  char Range [100];
  uint local_2c;
  int iFanin;
  int iObj;
  int j;
  int k;
  Wln_Ntk_t *p_local;
  FILE *pFile_local;
  
  fprintf((FILE *)pFile,"module %s ( ",p->pName);
  fprintf((FILE *)pFile,"\n   ");
  iVar1 = Wln_NtkCiNum(p);
  if (0 < iVar1) {
    Wln_WriteVerIntVec(pFile,p,&p->vCis,3);
    fprintf((FILE *)pFile,",\n   ");
  }
  iVar1 = Wln_NtkCoNum(p);
  if (0 < iVar1) {
    Wln_WriteVerIntVec(pFile,p,&p->vCos,3);
  }
  fprintf((FILE *)pFile,"  );\n");
  local_2c = 1;
  do {
    iVar1 = Wln_NtkObjNum(p);
    if (iVar1 <= (int)local_2c) {
      Range[0x60] = '\0';
      Range[0x61] = '\0';
      Range[0x62] = '\0';
      Range[99] = '\0';
      fprintf((FILE *)pFile,"\n");
      for (iFanin = 0; iVar1 = Wln_NtkFfNum(p), iFanin < iVar1; iFanin = iFanin + 1) {
        iVar1 = Wln_NtkFf(p,iFanin);
        memcpy(&local_f8,&DAT_00fa9fc0,0x40);
        fprintf((FILE *)pFile,"         ");
        fprintf((FILE *)pFile,"%s (","ABC_DFFRSE");
        for (iObj = 0; iVar4 = Wln_ObjFaninNum(p,iVar1), iObj < iVar4; iObj = iObj + 1) {
          iVar4 = Wln_ObjFanin(p,iVar1,iObj);
          Range[0x60] = (char)iVar4;
          Range[0x61] = (char)((uint)iVar4 >> 8);
          Range[0x62] = (char)((uint)iVar4 >> 0x10);
          Range[99] = (char)((uint)iVar4 >> 0x18);
          if ((iVar4 != 0) && (iVar4 != 0)) {
            pcVar14 = pInNames[(long)iObj + -1];
            pcVar6 = Wln_ObjName(p,iVar4);
            fprintf((FILE *)pFile," .%s(%s),",pcVar14,pcVar6);
          }
        }
        pcVar14 = Wln_ObjName(p,iVar1);
        fprintf((FILE *)pFile," .%s(%s) ) ;\n","q",pcVar14);
      }
      fprintf((FILE *)pFile,"\n");
      fprintf((FILE *)pFile,"endmodule\n\n");
      return;
    }
    uVar2 = Wln_ObjRangeEnd(p,local_2c);
    uVar3 = Wln_ObjRangeBeg(p,local_2c);
    iVar1 = Abc_AbsInt(uVar2);
    iVar1 = Abc_Base10Log(iVar1 + 1);
    iVar4 = Abc_AbsInt(uVar3);
    iVar4 = Abc_Base10Log(iVar4 + 1);
    bVar15 = false;
    if (p->fSmtLib == 0) {
      iVar5 = Wln_ObjIsSigned(p,local_2c);
      bVar15 = iVar5 != 0;
    }
    pcVar14 = "       ";
    if (bVar15) {
      pcVar14 = "signed ";
    }
    sprintf((char *)&Beg,"%s[%d:%d]%*s",pcVar14,(ulong)uVar2,(ulong)uVar3,
            (ulong)(8 - (iVar1 + iVar4 + (uint)((int)uVar2 < 0) + (uint)((int)uVar3 < 0))),"");
    fprintf((FILE *)pFile,"  ");
    iVar1 = Wln_ObjIsCi(p,local_2c);
    if (iVar1 == 0) {
      iVar1 = Wln_ObjIsCo(p,local_2c);
      if (iVar1 == 0) {
        fprintf((FILE *)pFile,"       ");
      }
      else {
        fprintf((FILE *)pFile,"output ");
      }
    }
    else {
      fprintf((FILE *)pFile,"input  ");
    }
    iVar1 = Wln_ObjIsCio(p,local_2c);
    if (iVar1 == 0) {
      iVar1 = Wln_ObjType(p,local_2c);
      if ((iVar1 == 0x2b) || (iVar1 = Wln_ObjType(p,local_2c), iVar1 == 0x2c)) {
        fprintf((FILE *)pFile,"reg  %s ",&Beg);
      }
      else {
        fprintf((FILE *)pFile,"wire %s ",&Beg);
      }
      iVar1 = Wln_ObjType(p,local_2c);
      if (iVar1 == 0x4d) {
        pcVar14 = Wln_ObjName(p,local_2c);
        uVar2 = Wln_ObjFanin1(p,local_2c);
        fprintf((FILE *)pFile,"%s ;              table%d",pcVar14,(ulong)uVar2);
        iVar1 = Wln_ObjFanin0(p,local_2c);
        pcVar14 = Wln_ObjName(p,iVar1);
        fprintf((FILE *)pFile," s%d_Index(%s, ",(ulong)local_2c,pcVar14);
        pcVar14 = Wln_ObjName(p,local_2c);
        fprintf((FILE *)pFile,"%s)",pcVar14);
      }
      else {
        iVar1 = Wln_ObjType(p,local_2c);
        if (iVar1 == 0x4b) {
          pcVar14 = Wln_ObjName(p,local_2c);
          fprintf((FILE *)pFile,"%s ;           LUT",pcVar14);
          iVar1 = Wln_ObjFanin0(p,local_2c);
          pcVar14 = Wln_ObjName(p,iVar1);
          fprintf((FILE *)pFile," lut%d (%s, ",(ulong)local_2c,pcVar14);
          for (iObj = 1; iVar1 = Wln_ObjFaninNum(p,local_2c), iObj < iVar1; iObj = iObj + 1) {
            iVar1 = Wln_ObjFanin(p,local_2c,iObj);
            pcVar14 = Wln_ObjName(p,iVar1);
            fprintf((FILE *)pFile,"%s, ",pcVar14);
          }
          pcVar14 = Wln_ObjName(p,local_2c);
          fprintf((FILE *)pFile,"%s)",pcVar14);
        }
        else {
          iVar1 = Wln_ObjIsConst(p,local_2c);
          if (iVar1 == 0) {
            iVar1 = Wln_ObjType(p,local_2c);
            if ((iVar1 != 0x49) && (iVar1 = Wln_ObjType(p,local_2c), iVar1 != 0x48)) {
              iVar1 = Wln_ObjType(p,local_2c);
              if (iVar1 == 0x2b) {
                pcVar14 = Wln_ObjName(p,local_2c);
                fprintf((FILE *)pFile,"%s ;\n",pcVar14);
                fprintf((FILE *)pFile,"         ");
                fprintf((FILE *)pFile,"always @( ");
                for (iObj = 0; iVar1 = Wln_ObjFaninNum(p,local_2c), iObj < iVar1; iObj = iObj + 1) {
                  Range._96_4_ = Wln_ObjFanin(p,local_2c,iObj);
                  if (Range._96_4_ != 0) {
                    pcVar14 = "";
                    if (iObj != 0) {
                      pcVar14 = " or ";
                    }
                    iVar1 = Wln_ObjFanin(p,local_2c,iObj);
                    pcVar6 = Wln_ObjName(p,iVar1);
                    fprintf((FILE *)pFile,"%s%s",pcVar14,pcVar6);
                  }
                }
                fprintf((FILE *)pFile," )\n");
                fprintf((FILE *)pFile,"           ");
                fprintf((FILE *)pFile,"begin\n");
                fprintf((FILE *)pFile,"             ");
                iVar1 = Wln_ObjFanin(p,local_2c,0);
                pcVar14 = Wln_ObjName(p,iVar1);
                fprintf((FILE *)pFile,"case ( %s )\n",pcVar14);
                for (iObj = 0; iVar1 = Wln_ObjFaninNum(p,local_2c), iObj < iVar1; iObj = iObj + 1) {
                  Range._96_4_ = Wln_ObjFanin(p,local_2c,iObj);
                  if ((Range._96_4_ != 0) && (iObj != 0)) {
                    fprintf((FILE *)pFile,"               ");
                    pcVar14 = Wln_ObjName(p,local_2c);
                    fprintf((FILE *)pFile,"%d : %s = ",(ulong)(iObj - 1),pcVar14);
                    iVar1 = Wln_ObjFanin(p,local_2c,iObj);
                    pcVar14 = Wln_ObjName(p,iVar1);
                    fprintf((FILE *)pFile,"%s ;\n",pcVar14);
                  }
                }
                fprintf((FILE *)pFile,"             ");
                fprintf((FILE *)pFile,"endcase\n");
                fprintf((FILE *)pFile,"           ");
                fprintf((FILE *)pFile,"end\n");
              }
              else {
                iVar1 = Wln_ObjType(p,local_2c);
                if (iVar1 == 0x2c) {
                  pcVar14 = Wln_ObjName(p,local_2c);
                  fprintf((FILE *)pFile,"%s ;\n",pcVar14);
                  fprintf((FILE *)pFile,"         ");
                  fprintf((FILE *)pFile,"always @( ");
                  for (iObj = 0; iVar1 = Wln_ObjFaninNum(p,local_2c), iObj < iVar1; iObj = iObj + 1)
                  {
                    Range._96_4_ = Wln_ObjFanin(p,local_2c,iObj);
                    if (Range._96_4_ != 0) {
                      pcVar14 = "";
                      if (iObj != 0) {
                        pcVar14 = " or ";
                      }
                      iVar1 = Wln_ObjFanin(p,local_2c,iObj);
                      pcVar6 = Wln_ObjName(p,iVar1);
                      fprintf((FILE *)pFile,"%s%s",pcVar14,pcVar6);
                    }
                  }
                  fprintf((FILE *)pFile," )\n");
                  fprintf((FILE *)pFile,"           ");
                  fprintf((FILE *)pFile,"begin\n");
                  fprintf((FILE *)pFile,"             ");
                  iVar1 = Wln_ObjFanin(p,local_2c,0);
                  pcVar14 = Wln_ObjName(p,iVar1);
                  fprintf((FILE *)pFile,"case ( %s )\n",pcVar14);
                  for (iObj = 0; iVar1 = Wln_ObjFaninNum(p,local_2c), iObj < iVar1; iObj = iObj + 1)
                  {
                    Range._96_4_ = Wln_ObjFanin(p,local_2c,iObj);
                    if ((Range._96_4_ != 0) && (iObj != 0)) {
                      fprintf((FILE *)pFile,"               ");
                      iVar1 = Wln_ObjFaninNum(p,local_2c);
                      fprintf((FILE *)pFile,"%d\'b",(ulong)(iVar1 - 1));
                      iFanin = Wln_ObjFaninNum(p,local_2c);
                      while (iFanin = iFanin + -1, 0 < iFanin) {
                        fprintf((FILE *)pFile,"%d",(ulong)(iFanin == iObj));
                      }
                      pcVar14 = Wln_ObjName(p,local_2c);
                      fprintf((FILE *)pFile," : %s = ",pcVar14);
                      iVar1 = Wln_ObjFanin(p,local_2c,iObj);
                      pcVar14 = Wln_ObjName(p,iVar1);
                      fprintf((FILE *)pFile,"%s ;\n",pcVar14);
                    }
                  }
                  fprintf((FILE *)pFile,"               ");
                  fprintf((FILE *)pFile,"default");
                  pcVar14 = Wln_ObjName(p,local_2c);
                  fprintf((FILE *)pFile," : %s = ",pcVar14);
                  uVar2 = Wln_ObjRange(p,local_2c);
                  fprintf((FILE *)pFile,"%d\'b",(ulong)uVar2);
                  iFanin = Wln_ObjRange(p,local_2c);
                  while (iFanin = iFanin + -1, -1 < iFanin) {
                    fprintf((FILE *)pFile,"%d",0);
                  }
                  fprintf((FILE *)pFile," ;\n");
                  fprintf((FILE *)pFile,"             ");
                  fprintf((FILE *)pFile,"endcase\n");
                  fprintf((FILE *)pFile,"           ");
                  fprintf((FILE *)pFile,"end\n");
                }
                else {
                  iVar1 = Wln_ObjType(p,local_2c);
                  if (iVar1 == 0x30) {
                    iVar1 = Wln_ObjFanin0(p,local_2c);
                    iVar1 = Wln_ObjRange(p,iVar1);
                    bVar13 = (byte)iVar1;
                    iVar4 = Wln_ObjRange(p,local_2c);
                    if (1 << (bVar13 & 0x1f) != iVar4) {
                      __assert_fail("(1 << nRange) == Wln_ObjRange(p, iObj)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wln/wlnWriteVer.c"
                                    ,0x111,"void Wln_WriteVerInt(FILE *, Wln_Ntk_t *)");
                    }
                    pcVar14 = Wln_ObjName(p,local_2c);
                    fprintf((FILE *)pFile,"%s ;\n",pcVar14);
                    for (iObj = 0; iVar4 = Wln_ObjRange(p,local_2c), iObj < iVar4; iObj = iObj + 1)
                    {
                      fprintf((FILE *)pFile,"         ");
                      fprintf((FILE *)pFile,"wire ");
                      pcVar14 = Wln_ObjName(p,local_2c);
                      fprintf((FILE *)pFile,"%s_",pcVar14);
                      for (iFanin = 0; iFanin < iVar1; iFanin = iFanin + 1) {
                        fprintf((FILE *)pFile,"%d",
                                (ulong)(iObj >> ((bVar13 - 1) - (char)iFanin & 0x1f) & 1));
                      }
                      fprintf((FILE *)pFile," = ");
                      for (iFanin = 0; iFanin < iVar1; iFanin = iFanin + 1) {
                        pcVar14 = "";
                        if (iFanin != 0) {
                          pcVar14 = " & ";
                        }
                        pcVar6 = " & ~";
                        if ((iObj >> ((bVar13 - 1) - (char)iFanin & 0x1f) & 1U) != 0) {
                          pcVar6 = "\r\n\t ";
                        }
                        iVar4 = Wln_ObjFanin(p,local_2c,0);
                        pcVar7 = Wln_ObjName(p,iVar4);
                        fprintf((FILE *)pFile,"%s%s%s[%d]",pcVar14,pcVar6 + 3,pcVar7,
                                (ulong)(uint)((iVar1 + -1) - iFanin));
                      }
                      fprintf((FILE *)pFile," ;\n");
                    }
                    fprintf((FILE *)pFile,"         ");
                    pcVar14 = Wln_ObjName(p,local_2c);
                    fprintf((FILE *)pFile,"assign %s = { ",pcVar14);
                    iObj = Wln_ObjRange(p,local_2c);
                    while (iObj = iObj + -1, -1 < iObj) {
                      iVar4 = Wln_ObjRange(p,local_2c);
                      pcVar14 = "";
                      if (iObj < iVar4 + -1) {
                        pcVar14 = ", ";
                      }
                      pcVar6 = Wln_ObjName(p,local_2c);
                      fprintf((FILE *)pFile,"%s%s_",pcVar14,pcVar6);
                      for (iFanin = 0; iFanin < iVar1; iFanin = iFanin + 1) {
                        fprintf((FILE *)pFile,"%d",
                                (ulong)(iObj >> ((bVar13 - 1) - (char)iFanin & 0x1f) & 1));
                      }
                    }
                    fprintf((FILE *)pFile," } ;\n");
                  }
                  else {
                    iVar1 = Wln_ObjType(p,local_2c);
                    if (iVar1 == 0x62) {
                      pcVar14 = Wln_ObjName(p,local_2c);
                      fprintf((FILE *)pFile,"%s ;\n",pcVar14);
                      fprintf((FILE *)pFile,"         ");
                      fprintf((FILE *)pFile,"assign ");
                      pcVar14 = Wln_ObjName(p,local_2c);
                      iVar1 = Wln_ObjFanin0(p,local_2c);
                      pcVar6 = Wln_ObjName(p,iVar1);
                      iVar1 = Wln_ObjFanin2(p,local_2c);
                      pcVar7 = Wln_ObjName(p,iVar1);
                      iVar1 = Wln_ObjFanin(p,local_2c,3);
                      pcVar8 = Wln_ObjName(p,iVar1);
                      iVar1 = Wln_ObjFanin1(p,local_2c);
                      pcVar9 = Wln_ObjName(p,iVar1);
                      iVar1 = Wln_ObjFanin2(p,local_2c);
                      pcVar10 = Wln_ObjName(p,iVar1);
                      iVar1 = Wln_ObjFanin(p,local_2c,3);
                      pcVar11 = Wln_ObjName(p,iVar1);
                      iVar1 = Wln_ObjFanin1(p,local_2c);
                      pcVar12 = Wln_ObjName(p,iVar1);
                      fprintf((FILE *)pFile,"%s = %s ? %s + %s + %s : %s - %s - %s ;\n",pcVar14,
                              pcVar6,pcVar7,pcVar8,pcVar9,pcVar10,pcVar11,pcVar12);
                    }
                    else {
                      iVar1 = Wln_ObjType(p,local_2c);
                      if ((iVar1 == 0x50) || (iVar1 = Wln_ObjType(p,local_2c), iVar1 == 0x51)) {
                        pcVar14 = Wln_ObjName(p,local_2c);
                        fprintf((FILE *)pFile,"%s ;\n",pcVar14);
                        fprintf((FILE *)pFile,"         ");
                        iVar1 = Wln_ObjType(p,local_2c);
                        pcVar14 = "ABC_WRITE";
                        if (iVar1 == 0x50) {
                          pcVar14 = "ABC_READ";
                        }
                        fprintf((FILE *)pFile,"%s (",pcVar14);
                        for (iObj = 0; iVar1 = Wln_ObjFaninNum(p,local_2c), iObj < iVar1;
                            iObj = iObj + 1) {
                          Range._96_4_ = Wln_ObjFanin(p,local_2c,iObj);
                          if (Range._96_4_ != 0) {
                            if (iObj == 0) {
                              local_3f0 = "mem_in";
                            }
                            else {
                              local_3f0 = "data";
                              if (iObj == 1) {
                                local_3f0 = "addr";
                              }
                            }
                            pcVar14 = Wln_ObjName(p,Range._96_4_);
                            fprintf((FILE *)pFile," .%s(%s),",local_3f0,pcVar14);
                          }
                        }
                        iVar1 = Wln_ObjType(p,local_2c);
                        pcVar14 = "mem_out";
                        if (iVar1 == 0x50) {
                          pcVar14 = "data";
                        }
                        pcVar6 = Wln_ObjName(p,local_2c);
                        fprintf((FILE *)pFile," .%s(%s) ) ;\n",pcVar14,pcVar6);
                      }
                      else {
                        iVar1 = Wln_ObjType(p,local_2c);
                        if (iVar1 != 0x59) {
                          pcVar14 = Wln_ObjName(p,local_2c);
                          fprintf((FILE *)pFile,"%-16s = ",pcVar14);
                          iVar1 = Wln_ObjType(p,local_2c);
                          if (iVar1 == 0xb) {
                            iVar1 = Wln_ObjFanin0(p,local_2c);
                            pcVar14 = Wln_ObjName(p,iVar1);
                            fprintf((FILE *)pFile,"%s",pcVar14);
                          }
                          else {
                            iVar1 = Wln_ObjType(p,local_2c);
                            if (iVar1 == 0x15) {
                              iVar1 = Wln_ObjFanin0(p,local_2c);
                              pcVar14 = Wln_ObjName(p,iVar1);
                              fprintf((FILE *)pFile,"%s ? ",pcVar14);
                              iVar1 = Wln_ObjFanin1(p,local_2c);
                              pcVar14 = Wln_ObjName(p,iVar1);
                              fprintf((FILE *)pFile,"%s : ",pcVar14);
                              iVar1 = Wln_ObjFanin2(p,local_2c);
                              pcVar14 = Wln_ObjName(p,iVar1);
                              fprintf((FILE *)pFile,"%s",pcVar14);
                            }
                            else {
                              iVar1 = Wln_ObjType(p,local_2c);
                              if (iVar1 == 0x3a) {
                                iVar1 = Wln_ObjFanin0(p,local_2c);
                                pcVar14 = Wln_ObjName(p,iVar1);
                                fprintf((FILE *)pFile,"-%s",pcVar14);
                              }
                              else {
                                iVar1 = Wln_ObjType(p,local_2c);
                                if (iVar1 == 0xc) {
                                  iVar1 = Wln_ObjFanin0(p,local_2c);
                                  pcVar14 = Wln_ObjName(p,iVar1);
                                  fprintf((FILE *)pFile,"~%s",pcVar14);
                                }
                                else {
                                  iVar1 = Wln_ObjType(p,local_2c);
                                  if (iVar1 == 0x24) {
                                    iVar1 = Wln_ObjFanin0(p,local_2c);
                                    pcVar14 = Wln_ObjName(p,iVar1);
                                    fprintf((FILE *)pFile,"!%s",pcVar14);
                                  }
                                  else {
                                    iVar1 = Wln_ObjType(p,local_2c);
                                    if (iVar1 == 0x1e) {
                                      iVar1 = Wln_ObjFanin0(p,local_2c);
                                      pcVar14 = Wln_ObjName(p,iVar1);
                                      fprintf((FILE *)pFile,"&%s",pcVar14);
                                    }
                                    else {
                                      iVar1 = Wln_ObjType(p,local_2c);
                                      if (iVar1 == 0x20) {
                                        iVar1 = Wln_ObjFanin0(p,local_2c);
                                        pcVar14 = Wln_ObjName(p,iVar1);
                                        fprintf((FILE *)pFile,"|%s",pcVar14);
                                      }
                                      else {
                                        iVar1 = Wln_ObjType(p,local_2c);
                                        if (iVar1 == 0x22) {
                                          iVar1 = Wln_ObjFanin0(p,local_2c);
                                          pcVar14 = Wln_ObjName(p,iVar1);
                                          fprintf((FILE *)pFile,"^%s",pcVar14);
                                        }
                                        else {
                                          iVar1 = Wln_ObjType(p,local_2c);
                                          if (iVar1 == 0x1f) {
                                            iVar1 = Wln_ObjFanin0(p,local_2c);
                                            pcVar14 = Wln_ObjName(p,iVar1);
                                            fprintf((FILE *)pFile,"~&%s",pcVar14);
                                          }
                                          else {
                                            iVar1 = Wln_ObjType(p,local_2c);
                                            if (iVar1 == 0x21) {
                                              iVar1 = Wln_ObjFanin0(p,local_2c);
                                              pcVar14 = Wln_ObjName(p,iVar1);
                                              fprintf((FILE *)pFile,"~|%s",pcVar14);
                                            }
                                            else {
                                              iVar1 = Wln_ObjType(p,local_2c);
                                              if (iVar1 == 0x23) {
                                                iVar1 = Wln_ObjFanin0(p,local_2c);
                                                pcVar14 = Wln_ObjName(p,iVar1);
                                                fprintf((FILE *)pFile,"~^%s",pcVar14);
                                              }
                                              else {
                                                iVar1 = Wln_ObjType(p,local_2c);
                                                if (iVar1 == 0x5b) {
                                                  iVar1 = Wln_ObjFanin0(p,local_2c);
                                                  pcVar14 = Wln_ObjName(p,iVar1);
                                                  uVar2 = Wln_ObjRangeEnd(p,local_2c);
                                                  uVar3 = Wln_ObjRangeBeg(p,local_2c);
                                                  fprintf((FILE *)pFile,"%s [%d:%d]",pcVar14,
                                                          (ulong)uVar2,(ulong)uVar3);
                                                }
                                                else {
                                                  iVar1 = Wln_ObjType(p,local_2c);
                                                  if (iVar1 == 0x5e) {
                                                    iVar1 = Wln_ObjRange(p,local_2c);
                                                    iVar4 = Wln_ObjFanin0(p,local_2c);
                                                    iVar4 = Wln_ObjRange(p,iVar4);
                                                    iVar5 = Wln_ObjFanin0(p,local_2c);
                                                    pcVar14 = Wln_ObjName(p,iVar5);
                                                    iVar5 = Wln_ObjFanin0(p,local_2c);
                                                    iVar5 = Wln_ObjRange(p,iVar5);
                                                    iObj_00 = Wln_ObjFanin0(p,local_2c);
                                                    pcVar6 = Wln_ObjName(p,iObj_00);
                                                    fprintf((FILE *)pFile,"{ {%d{%s[%d]}}, %s }",
                                                            (ulong)(uint)(iVar1 - iVar4),pcVar14,
                                                            (ulong)(iVar5 - 1),pcVar6);
                                                  }
                                                  else {
                                                    iVar1 = Wln_ObjType(p,local_2c);
                                                    if (iVar1 == 0x5d) {
                                                      iVar1 = Wln_ObjRange(p,local_2c);
                                                      iVar4 = Wln_ObjFanin0(p,local_2c);
                                                      iVar4 = Wln_ObjRange(p,iVar4);
                                                      iVar5 = Wln_ObjFanin0(p,local_2c);
                                                      pcVar14 = Wln_ObjName(p,iVar5);
                                                      fprintf((FILE *)pFile,"{ {%d{1\'b0}}, %s }",
                                                              (ulong)(uint)(iVar1 - iVar4),pcVar14);
                                                    }
                                                    else {
                                                      iVar1 = Wln_ObjType(p,local_2c);
                                                      if (iVar1 == 0x5c) {
                                                        fprintf((FILE *)pFile,"{");
                                                        for (iObj = 0;
                                                            iVar1 = Wln_ObjFaninNum(p,local_2c),
                                                            iObj < iVar1; iObj = iObj + 1) {
                                                          Range._96_4_ = Wln_ObjFanin(p,local_2c,
                                                                                      iObj);
                                                          if (Range._96_4_ != 0) {
                                                            iVar1 = Wln_ObjFanin(p,local_2c,iObj);
                                                            pcVar14 = Wln_ObjName(p,iVar1);
                                                            iVar1 = Wln_ObjFaninNum(p,local_2c);
                                                            pcVar6 = ",";
                                                            if (iObj == iVar1 + -1) {
                                                              pcVar6 = "";
                                                            }
                                                            fprintf((FILE *)pFile," %s%s",pcVar14,
                                                                    pcVar6);
                                                          }
                                                        }
                                                        fprintf((FILE *)pFile," }");
                                                      }
                                                      else {
                                                        iVar1 = Wln_ObjFanin(p,local_2c,0);
                                                        pcVar14 = Wln_ObjName(p,iVar1);
                                                        fprintf((FILE *)pFile,"%s ",pcVar14);
                                                        iVar1 = Wln_ObjType(p,local_2c);
                                                        if (iVar1 == 0x45) {
                                                          fprintf((FILE *)pFile,">>");
                                                        }
                                                        else {
                                                          iVar1 = Wln_ObjType(p,local_2c);
                                                          if (iVar1 == 0x47) {
                                                            fprintf((FILE *)pFile,">>>");
                                                          }
                                                          else {
                                                            iVar1 = Wln_ObjType(p,local_2c);
                                                            if (iVar1 == 0x44) {
                                                              fprintf((FILE *)pFile,"<<");
                                                            }
                                                            else {
                                                              iVar1 = Wln_ObjType(p,local_2c);
                                                              if (iVar1 == 0x46) {
                                                                fprintf((FILE *)pFile,"<<<");
                                                              }
                                                              else {
                                                                iVar1 = Wln_ObjType(p,local_2c);
                                                                if (iVar1 == 0xd) {
                                                                  fprintf((FILE *)pFile,"&");
                                                                }
                                                                else {
                                                                  iVar1 = Wln_ObjType(p,local_2c);
                                                                  if (iVar1 == 0xf) {
                                                                    fprintf((FILE *)pFile,"|");
                                                                  }
                                                                  else {
                                                                    iVar1 = Wln_ObjType(p,local_2c);
                                                                    if (iVar1 == 0x11) {
                                                                      fprintf((FILE *)pFile,"^");
                                                                    }
                                                                    else {
                                                                      iVar1 = Wln_ObjType(p,local_2c
                                                                                         );
                                                                      if (iVar1 == 0xe) {
                                                                        fprintf((FILE *)pFile,"~&");
                                                                      }
                                                                      else {
                                                                        iVar1 = Wln_ObjType(p,
                                                  local_2c);
                                                  if (iVar1 == 0x10) {
                                                    fprintf((FILE *)pFile,"~|");
                                                  }
                                                  else {
                                                    iVar1 = Wln_ObjType(p,local_2c);
                                                    if (iVar1 == 0x12) {
                                                      fprintf((FILE *)pFile,"~^");
                                                    }
                                                    else {
                                                      iVar1 = Wln_ObjType(p,local_2c);
                                                      if (iVar1 == 0x5f) {
                                                        fprintf((FILE *)pFile,"=>");
                                                      }
                                                      else {
                                                        iVar1 = Wln_ObjType(p,local_2c);
                                                        if (iVar1 == 0x25) {
                                                          fprintf((FILE *)pFile,"&&");
                                                        }
                                                        else {
                                                          iVar1 = Wln_ObjType(p,local_2c);
                                                          if (iVar1 == 0x27) {
                                                            fprintf((FILE *)pFile,"||");
                                                          }
                                                          else {
                                                            iVar1 = Wln_ObjType(p,local_2c);
                                                            if (iVar1 == 0x29) {
                                                              fprintf((FILE *)pFile,"^^");
                                                            }
                                                            else {
                                                              iVar1 = Wln_ObjType(p,local_2c);
                                                              if (iVar1 == 0x42) {
                                                                fprintf((FILE *)pFile,"==");
                                                              }
                                                              else {
                                                                iVar1 = Wln_ObjType(p,local_2c);
                                                                if (iVar1 == 0x43) {
                                                                  fprintf((FILE *)pFile,"!=");
                                                                }
                                                                else {
                                                                  iVar1 = Wln_ObjType(p,local_2c);
                                                                  if (iVar1 == 0x3e) {
                                                                    fprintf((FILE *)pFile,"<");
                                                                  }
                                                                  else {
                                                                    iVar1 = Wln_ObjType(p,local_2c);
                                                                    if (iVar1 == 0x41) {
                                                                      fprintf((FILE *)pFile,">");
                                                                    }
                                                                    else {
                                                                      iVar1 = Wln_ObjType(p,local_2c
                                                                                         );
                                                                      if (iVar1 == 0x3f) {
                                                                        fprintf((FILE *)pFile,"<=");
                                                                      }
                                                                      else {
                                                                        iVar1 = Wln_ObjType(p,
                                                  local_2c);
                                                  if (iVar1 == 0x40) {
                                                    fprintf((FILE *)pFile,">=");
                                                  }
                                                  else {
                                                    iVar1 = Wln_ObjType(p,local_2c);
                                                    if (iVar1 == 0x32) {
                                                      fprintf((FILE *)pFile,"+");
                                                    }
                                                    else {
                                                      iVar1 = Wln_ObjType(p,local_2c);
                                                      if (iVar1 == 0x33) {
                                                        fprintf((FILE *)pFile,"-");
                                                      }
                                                      else {
                                                        iVar1 = Wln_ObjType(p,local_2c);
                                                        if (iVar1 == 0x34) {
                                                          fprintf((FILE *)pFile,"*");
                                                        }
                                                        else {
                                                          iVar1 = Wln_ObjType(p,local_2c);
                                                          if (iVar1 == 0x36) {
                                                            fprintf((FILE *)pFile,"/");
                                                          }
                                                          else {
                                                            iVar1 = Wln_ObjType(p,local_2c);
                                                            if (iVar1 == 0x38) {
                                                              fprintf((FILE *)pFile,"%%");
                                                            }
                                                            else {
                                                              iVar1 = Wln_ObjType(p,local_2c);
                                                              if (iVar1 == 0x37) {
                                                                fprintf((FILE *)pFile,"%%");
                                                              }
                                                              else {
                                                                iVar1 = Wln_ObjType(p,local_2c);
                                                                if (iVar1 == 0x39) {
                                                                  fprintf((FILE *)pFile,"**");
                                                                }
                                                                else {
                                                                  iVar1 = Wln_ObjType(p,local_2c);
                                                                  if (iVar1 == 0x3b) {
                                                                    fprintf((FILE *)pFile,"@");
                                                                  }
                                                                  else {
                                                                    iVar1 = Wln_ObjType(p,local_2c);
                                                                    if (iVar1 != 0x60) {
                                                                      pcVar14 = Wln_ObjName(p,
                                                  local_2c);
                                                  uVar2 = Wln_ObjType(p,local_2c);
                                                  printf(
                                                  "Failed to write node \"%s\" with unknown operator type (%d).\n"
                                                  ,pcVar14,(ulong)uVar2);
                                                  fprintf((FILE *)pFile,"???\n");
                                                  goto LAB_0042eeb4;
                                                  }
                                                  fprintf((FILE *)pFile,"#");
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  iVar1 = Wln_ObjFanin(p,local_2c,1);
                                                  pcVar14 = Wln_ObjName(p,iVar1);
                                                  fprintf((FILE *)pFile," %s",pcVar14);
                                                  iVar1 = Wln_ObjFaninNum(p,local_2c);
                                                  if ((iVar1 == 3) &&
                                                     (iVar1 = Wln_ObjType(p,local_2c), iVar1 == 0x32
                                                     )) {
                                                    iVar1 = Wln_ObjFanin(p,local_2c,2);
                                                    pcVar14 = Wln_ObjName(p,iVar1);
                                                    fprintf((FILE *)pFile," + %s",pcVar14);
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                          goto LAB_0042ee4f;
                        }
                        pcVar14 = Wln_ObjName(p,local_2c);
                        fprintf((FILE *)pFile,"%s ;\n",pcVar14);
                      }
                    }
                  }
                }
              }
              goto LAB_0042eeb4;
            }
            uVar2 = Wln_ObjFanin1(p,local_2c);
            iVar1 = Wln_ObjRange(p,local_2c);
            if (((int)uVar2 < 1) || (iVar4 = Wln_ObjRange(p,local_2c), iVar4 <= (int)uVar2)) {
              __assert_fail("Num0 > 0 && Num0 < Wln_ObjRange(p, iObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wln/wlnWriteVer.c"
                            ,0xcb,"void Wln_WriteVerInt(FILE *, Wln_Ntk_t *)");
            }
            pcVar14 = Wln_ObjName(p,local_2c);
            fprintf((FILE *)pFile,"%-16s = ",pcVar14);
            iVar4 = Wln_ObjType(p,local_2c);
            if (iVar4 == 0x49) {
              iVar4 = Wln_ObjFanin0(p,local_2c);
              pcVar14 = Wln_ObjName(p,iVar4);
              iVar4 = Wln_ObjFanin0(p,local_2c);
              pcVar6 = Wln_ObjName(p,iVar4);
              fprintf((FILE *)pFile,"(%s >> %d) | (%s << %d)",pcVar14,(ulong)uVar2,pcVar6,
                      (ulong)(iVar1 - uVar2));
            }
            else {
              iVar4 = Wln_ObjFanin0(p,local_2c);
              pcVar14 = Wln_ObjName(p,iVar4);
              iVar4 = Wln_ObjFanin0(p,local_2c);
              pcVar6 = Wln_ObjName(p,iVar4);
              fprintf((FILE *)pFile,"(%s << %d) | (%s >> %d)",pcVar14,(ulong)uVar2,pcVar6,
                      (ulong)(iVar1 - uVar2));
            }
          }
          else {
            pcVar14 = Wln_ObjName(p,local_2c);
            pcVar6 = Wln_ObjConstString(p,local_2c);
            fprintf((FILE *)pFile,"%-16s = %s",pcVar14,pcVar6);
          }
        }
      }
LAB_0042ee4f:
      bVar15 = false;
      if (p->fSmtLib != 0) {
        iVar1 = Wln_ObjIsSigned(p,local_2c);
        bVar15 = iVar1 != 0;
      }
      pcVar14 = "";
      if (bVar15) {
        pcVar14 = " // signed SMT-LIB operator";
      }
      fprintf((FILE *)pFile," ;%s\n",pcVar14);
    }
    else {
      pcVar14 = Wln_ObjName(p,local_2c);
      fprintf((FILE *)pFile,"wire %s %s ;\n",&Beg,pcVar14);
      iVar1 = Wln_ObjIsCi(p,local_2c);
      if (iVar1 == 0) {
        fprintf((FILE *)pFile,"  assign                         ");
        pcVar14 = Wln_ObjName(p,local_2c);
        iVar1 = Wln_ObjFanin0(p,local_2c);
        pcVar6 = Wln_ObjName(p,iVar1);
        fprintf((FILE *)pFile,"%-16s = %s ;\n",pcVar14,pcVar6);
      }
    }
LAB_0042eeb4:
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

void Wln_WriteVerInt( FILE * pFile, Wln_Ntk_t * p )
{
    int k, j, iObj, iFanin;
    char Range[100];
    fprintf( pFile, "module %s ( ", p->pName );
    fprintf( pFile, "\n   " );
    if ( Wln_NtkCiNum(p) > 0 )
    {
        Wln_WriteVerIntVec( pFile, p, &p->vCis, 3 );
        fprintf( pFile, ",\n   " );
    }
    if ( Wln_NtkCoNum(p) > 0 )
        Wln_WriteVerIntVec( pFile, p, &p->vCos, 3 );
    fprintf( pFile, "  );\n" );
    Wln_NtkForEachObj( p, iObj )
    {
        int End = Wln_ObjRangeEnd(p, iObj);
        int Beg = Wln_ObjRangeBeg(p, iObj);
        int nDigits = Abc_Base10Log(Abc_AbsInt(End)+1) + Abc_Base10Log(Abc_AbsInt(Beg)+1) + (int)(End < 0) + (int)(Beg < 0);
        sprintf( Range, "%s[%d:%d]%*s", (!p->fSmtLib && Wln_ObjIsSigned(p, iObj)) ? "signed ":"       ", End, Beg, 8-nDigits, "" );
        fprintf( pFile, "  " );
        if ( Wln_ObjIsCi(p, iObj) )
            fprintf( pFile, "input  " );
        else if ( Wln_ObjIsCo(p, iObj) )
            fprintf( pFile, "output " );
        else
            fprintf( pFile, "       " );
        if ( Wln_ObjIsCio(p, iObj) )
        {
            fprintf( pFile, "wire %s %s ;\n", Range, Wln_ObjName(p, iObj) );
            if ( Wln_ObjIsCi(p, iObj) )
                continue;
            fprintf( pFile, "  assign                         " );
            fprintf( pFile, "%-16s = %s ;\n", Wln_ObjName(p, iObj), Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            continue;
        }
        if ( Wln_ObjType(p, iObj) == ABC_OPER_SEL_NMUX || Wln_ObjType(p, iObj) == ABC_OPER_SEL_SEL )
            fprintf( pFile, "reg  %s ", Range );
        else
            fprintf( pFile, "wire %s ", Range );
        if ( Wln_ObjType(p, iObj) == ABC_OPER_TABLE )
        {
            // wire [3:0] s4972; table0 s4972_Index(s4971, s4972);
            fprintf( pFile, "%s ;              table%d", Wln_ObjName(p, iObj), Wln_ObjFanin1(p, iObj) );
            fprintf( pFile, " s%d_Index(%s, ", iObj, Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            fprintf( pFile, "%s)",             Wln_ObjName(p, iObj) );
        }
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_LUT )
        {
            // wire [3:0] s4972; LUT lut4972_Index(s4971, s4972);
            fprintf( pFile, "%s ;           LUT", Wln_ObjName(p, iObj) );
            fprintf( pFile, " lut%d (%s, ", iObj, Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            for ( k = 1; k < Wln_ObjFaninNum(p, iObj); k++ )
                fprintf( pFile, "%s, ", Wln_ObjName(p, Wln_ObjFanin(p, iObj, k)) );
            fprintf( pFile, "%s)",             Wln_ObjName(p, iObj) );
        }
        else if ( Wln_ObjIsConst(p, iObj) )
            fprintf( pFile, "%-16s = %s", Wln_ObjName(p, iObj), Wln_ObjConstString(p, iObj) );
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_SHIFT_ROTR || Wln_ObjType(p, iObj) == ABC_OPER_SHIFT_ROTL )
        {
            //  wire [27:0] s4960 = (s57 >> 17) | (s57 << 11);
            int Num0 = Wln_ObjFanin1(p, iObj);
            int Num1 = Wln_ObjRange(p, iObj) - Num0;
            assert( Num0 > 0 && Num0 < Wln_ObjRange(p, iObj) );
            fprintf( pFile, "%-16s = ", Wln_ObjName(p, iObj) );
            if ( Wln_ObjType(p, iObj) == ABC_OPER_SHIFT_ROTR )
                fprintf( pFile, "(%s >> %d) | (%s << %d)", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)), Num0, Wln_ObjName(p, Wln_ObjFanin0(p, iObj)), Num1 );
            else
                fprintf( pFile, "(%s << %d) | (%s >> %d)", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)), Num0, Wln_ObjName(p, Wln_ObjFanin0(p, iObj)), Num1 );
        }
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_SEL_NMUX )
        {
            fprintf( pFile, "%s ;\n", Wln_ObjName(p, iObj) );
            fprintf( pFile, "         " );
            fprintf( pFile, "always @( " );
            Wln_ObjForEachFanin( p, iObj, iFanin, k )
                fprintf( pFile, "%s%s", k ? " or ":"", Wln_ObjName(p, Wln_ObjFanin(p, iObj, k)) );
            fprintf( pFile, " )\n" );
            fprintf( pFile, "           " );
            fprintf( pFile, "begin\n" );
            fprintf( pFile, "             " );
            fprintf( pFile, "case ( %s )\n", Wln_ObjName(p, Wln_ObjFanin(p, iObj, 0)) );
            Wln_ObjForEachFanin( p, iObj, iFanin, k )
            {
                if ( !k ) continue;
                fprintf( pFile, "               " );
                fprintf( pFile, "%d : %s = ", k-1, Wln_ObjName(p, iObj) );
                fprintf( pFile, "%s ;\n", Wln_ObjName(p, Wln_ObjFanin(p, iObj, k)) );
            }
            fprintf( pFile, "             " );
            fprintf( pFile, "endcase\n" );
            fprintf( pFile, "           " );
            fprintf( pFile, "end\n" );
            continue;
        }
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_SEL_SEL )
        {
            fprintf( pFile, "%s ;\n", Wln_ObjName(p, iObj) );
            fprintf( pFile, "         " );
            fprintf( pFile, "always @( " );
            Wln_ObjForEachFanin( p, iObj, iFanin, k )
                fprintf( pFile, "%s%s", k ? " or ":"", Wln_ObjName(p, Wln_ObjFanin(p, iObj, k)) );
            fprintf( pFile, " )\n" );
            fprintf( pFile, "           " );
            fprintf( pFile, "begin\n" );
            fprintf( pFile, "             " );
            fprintf( pFile, "case ( %s )\n", Wln_ObjName(p, Wln_ObjFanin(p, iObj, 0)) );
            Wln_ObjForEachFanin( p, iObj, iFanin, k )
            {
                if ( !k ) continue;
                fprintf( pFile, "               " );
                fprintf( pFile, "%d\'b", Wln_ObjFaninNum(p, iObj)-1 );
                for ( j = Wln_ObjFaninNum(p, iObj)-1; j > 0; j-- )
                    fprintf( pFile, "%d", (int)(j==k) );
                fprintf( pFile, " : %s = ", Wln_ObjName(p, iObj) );
                fprintf( pFile, "%s ;\n", Wln_ObjName(p, Wln_ObjFanin(p, iObj, k)) );
            }
            fprintf( pFile, "               " );
            fprintf( pFile, "default" );
            fprintf( pFile, " : %s = ", Wln_ObjName(p, iObj) );
            fprintf( pFile, "%d\'b", Wln_ObjRange(p, iObj) );
            for ( j = Wln_ObjRange(p, iObj)-1; j >= 0; j-- )
                fprintf( pFile, "%d", 0 );
            fprintf( pFile, " ;\n" );
            fprintf( pFile, "             " );
            fprintf( pFile, "endcase\n" );
            fprintf( pFile, "           " );
            fprintf( pFile, "end\n" );
            continue;
        }
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_SEL_DEC )
        {
            int nRange = Wln_ObjRange(p, Wln_ObjFanin0(p, iObj));
            assert( (1 << nRange) == Wln_ObjRange(p, iObj) );
            fprintf( pFile, "%s ;\n", Wln_ObjName(p, iObj) );
            for ( k = 0; k < Wln_ObjRange(p, iObj); k++ )
            {
                fprintf( pFile, "         " );
                fprintf( pFile, "wire " );
                fprintf( pFile, "%s_", Wln_ObjName(p, iObj) );
                for ( j = 0; j < nRange; j++ )
                    fprintf( pFile, "%d", (k >> (nRange-1-j)) & 1 );
                fprintf( pFile, " = " );
                for ( j = 0; j < nRange; j++ )
                    fprintf( pFile, "%s%s%s[%d]", 
                        j ? " & ":"", ((k >> (nRange-1-j)) & 1) ? " ":"~", 
                        Wln_ObjName(p, Wln_ObjFanin(p, iObj, 0)), nRange-1-j );
                fprintf( pFile, " ;\n" );
            }
            fprintf( pFile, "         " );
            fprintf( pFile, "assign %s = { ", Wln_ObjName(p, iObj) );
            for ( k = Wln_ObjRange(p, iObj)-1; k >= 0; k-- )
            {
                fprintf( pFile, "%s%s_", k < Wln_ObjRange(p, iObj)-1 ? ", ":"", Wln_ObjName(p, iObj) );
                for ( j = 0; j < nRange; j++ )
                    fprintf( pFile, "%d", (k >> (nRange-1-j)) & 1 );
            }
            fprintf( pFile, " } ;\n" );
            continue;
        }
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_ADDSUB )
        {
            // out = mode ? a+b+cin : a-b-cin
            fprintf( pFile, "%s ;\n", Wln_ObjName(p, iObj) );
            fprintf( pFile, "         " );
            fprintf( pFile, "assign " );
            fprintf( pFile, "%s = %s ? %s + %s + %s : %s - %s - %s ;\n", 
                        Wln_ObjName(p, iObj), Wln_ObjName(p, Wln_ObjFanin0(p, iObj)),
                        Wln_ObjName(p, Wln_ObjFanin2(p, iObj)), Wln_ObjName(p, Wln_ObjFanin(p, iObj,3)), Wln_ObjName(p, Wln_ObjFanin1(p, iObj)),
                        Wln_ObjName(p, Wln_ObjFanin2(p, iObj)), Wln_ObjName(p, Wln_ObjFanin(p, iObj,3)), Wln_ObjName(p, Wln_ObjFanin1(p, iObj)) 
                   );
            continue;
        }
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_RAMR || Wln_ObjType(p, iObj) == ABC_OPER_RAMW )
        {
            if ( 1 )
            {
                fprintf( pFile, "%s ;\n", Wln_ObjName(p, iObj) );
                fprintf( pFile, "         " );
                fprintf( pFile, "%s (", Wln_ObjType(p, iObj) == ABC_OPER_RAMR ? "ABC_READ" : "ABC_WRITE" );
                Wln_ObjForEachFanin( p, iObj, iFanin, k )
                    fprintf( pFile, " .%s(%s),", k==0 ? "mem_in" : (k==1 ? "addr": "data"), Wln_ObjName(p, iFanin) );
                fprintf( pFile, " .%s(%s) ) ;\n", Wln_ObjType(p, iObj) == ABC_OPER_RAMR ? "data" : "mem_out", Wln_ObjName(p, iObj) );
                continue;
            }
            else
            {
                int nBitsMem  = Wln_ObjRange(p,  Wln_ObjFanin(p, iObj, 0) );
                //int nBitsAddr = Wln_ObjRange(p,  Wln_ObjFanin(p, iObj, 1) );
                int nBitsDat  = Wln_ObjType(p, iObj) == ABC_OPER_RAMR ? Wln_ObjRange(p, iObj) : Wln_ObjRange(p, Wln_ObjFanin(p, iObj, 2));
                int Depth     = nBitsMem / nBitsDat;
                assert( nBitsMem % nBitsDat == 0 );
                fprintf( pFile, "%s ;\n", Wln_ObjName(p, iObj) );
                fprintf( pFile, "         " );
                fprintf( pFile, "%s_%d (", Wln_ObjType(p, iObj) == ABC_OPER_RAMR ? "CPL_MEM_READ" : "CPL_MEM_WRITE", Depth );
                Wln_ObjForEachFanin( p, iObj, iFanin, k )
                    fprintf( pFile, " .%s(%s),", k==0 ? "mem_data_in" : (k==1 ? "addr_in": "data_in"), Wln_ObjName(p, iFanin) );
                fprintf( pFile, " .%s(%s) ) ;\n", "data_out", Wln_ObjName(p, iObj) );
                continue;
            }
        }
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_DFFRSE )
        {
            fprintf( pFile, "%s ;\n", Wln_ObjName(p, iObj) );
            continue;
        }
        else 
        {
            fprintf( pFile, "%-16s = ", Wln_ObjName(p, iObj) );
            if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_BUF )
                fprintf( pFile, "%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_MUX )
            {
                fprintf( pFile, "%s ? ", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
                fprintf( pFile, "%s : ", Wln_ObjName(p, Wln_ObjFanin1(p, iObj)) );
                fprintf( pFile, "%s",    Wln_ObjName(p, Wln_ObjFanin2(p, iObj)) );
            }
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_MIN )
                fprintf( pFile, "-%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_INV )
                fprintf( pFile, "~%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_LOGIC_NOT )
                fprintf( pFile, "!%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_RED_AND )
                fprintf( pFile, "&%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_RED_OR )
                fprintf( pFile, "|%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_RED_XOR )
                fprintf( pFile, "^%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_RED_NAND )
                fprintf( pFile, "~&%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_RED_NOR )
                fprintf( pFile, "~|%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_RED_NXOR )
                fprintf( pFile, "~^%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_SLICE )
                fprintf( pFile, "%s [%d:%d]", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)), Wln_ObjRangeEnd(p, iObj), Wln_ObjRangeBeg(p, iObj) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_SIGNEXT )
                fprintf( pFile, "{ {%d{%s[%d]}}, %s }", Wln_ObjRange(p, iObj) - Wln_ObjRange(p, Wln_ObjFanin0(p, iObj)), Wln_ObjName(p, Wln_ObjFanin0(p, iObj)), Wln_ObjRange(p, Wln_ObjFanin0(p, iObj)) - 1, Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_ZEROPAD )
                fprintf( pFile, "{ {%d{1\'b0}}, %s }", Wln_ObjRange(p, iObj) - Wln_ObjRange(p, Wln_ObjFanin0(p, iObj)), Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_CONCAT )
            {
                fprintf( pFile, "{" );
                Wln_ObjForEachFanin( p, iObj, iFanin, k )
                    fprintf( pFile, " %s%s", Wln_ObjName(p, Wln_ObjFanin(p, iObj, k)), k == Wln_ObjFaninNum(p, iObj)-1 ? "":"," );
                fprintf( pFile, " }" );
            }
            else
            {
                fprintf( pFile, "%s ", Wln_ObjName(p, Wln_ObjFanin(p, iObj, 0)) );
                if ( Wln_ObjType(p, iObj) == ABC_OPER_SHIFT_R )
                    fprintf( pFile, ">>" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_SHIFT_RA )
                    fprintf( pFile, ">>>" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_SHIFT_L )
                    fprintf( pFile, "<<" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_SHIFT_LA )
                    fprintf( pFile, "<<<" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_AND )
                    fprintf( pFile, "&" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_OR )
                    fprintf( pFile, "|" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_XOR )
                    fprintf( pFile, "^" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_NAND )
                    fprintf( pFile, "~&" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_NOR )
                    fprintf( pFile, "~|" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_NXOR )
                    fprintf( pFile, "~^" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_LOGIC_IMPL )
                    fprintf( pFile, "=>" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_LOGIC_AND )
                    fprintf( pFile, "&&" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_LOGIC_OR )
                    fprintf( pFile, "||" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_LOGIC_XOR )
                    fprintf( pFile, "^^" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_COMP_EQU )
                    fprintf( pFile, "==" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_COMP_NOTEQU )
                    fprintf( pFile, "!=" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_COMP_LESS )
                    fprintf( pFile, "<" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_COMP_MORE )
                    fprintf( pFile, ">" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_COMP_LESSEQU )
                    fprintf( pFile, "<=" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_COMP_MOREEQU )
                    fprintf( pFile, ">=" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_ADD )
                    fprintf( pFile, "+" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_SUB )
                    fprintf( pFile, "-" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_MUL )
                    fprintf( pFile, "*" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_DIV )
                    fprintf( pFile, "/" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_REM )
                    fprintf( pFile, "%%" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_MOD )
                    fprintf( pFile, "%%" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_POW )
                    fprintf( pFile, "**" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_SQRT )
                    fprintf( pFile, "@" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_SQUARE )
                    fprintf( pFile, "#" );
                else 
                {
                    //assert( 0 );
                    printf( "Failed to write node \"%s\" with unknown operator type (%d).\n", Wln_ObjName(p, iObj), Wln_ObjType(p, iObj) );
                    fprintf( pFile, "???\n" );
                    continue;
                }
                fprintf( pFile, " %s", Wln_ObjName(p, Wln_ObjFanin(p, iObj, 1)) );
                if ( Wln_ObjFaninNum(p, iObj) == 3 && Wln_ObjType(p, iObj) == ABC_OPER_ARI_ADD ) 
                    fprintf( pFile, " + %s", Wln_ObjName(p, Wln_ObjFanin(p, iObj, 2)) );
            }
        }
        fprintf( pFile, " ;%s\n", (p->fSmtLib && Wln_ObjIsSigned(p, iObj)) ? " // signed SMT-LIB operator" : "" );
    }
    iFanin = 0;
    // write DFFs in the end
    fprintf( pFile, "\n" );
    Wln_NtkForEachFf( p, iObj, j )
    {
        char * pInNames[8] = {"d", "clk", "reset", "set", "enable", "async", "sre", "init"};
        fprintf( pFile, "         " );
        fprintf( pFile, "%s (", "ABC_DFFRSE" );
        Wln_ObjForEachFanin( p, iObj, iFanin, k )
            if ( iFanin ) fprintf( pFile, " .%s(%s),", pInNames[k], Wln_ObjName(p, iFanin) );
        fprintf( pFile, " .%s(%s) ) ;\n", "q", Wln_ObjName(p, iObj) );
    }
    fprintf( pFile, "\n" );
    fprintf( pFile, "endmodule\n\n" );
}